

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock_or_throw.h
# Opt level: O0

void tools::do_check<cpp_db::connection_interface>
               (weak_ptr<cpp_db::connection_interface> *ptr,char *context)

{
  bool bVar1;
  runtime_error *this;
  char *local_38;
  char *context_local;
  weak_ptr<cpp_db::connection_interface> *ptr_local;
  
  bVar1 = std::__weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>::expired
                    (&ptr->
                      super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>);
  if (bVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_38 = context;
    if (context == (char *)0x0) {
      local_38 = "Invalid pointer!";
    }
    std::runtime_error::runtime_error(this,local_38);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void do_check(const std::weak_ptr<T> &ptr, const char *context)
{
	if (ptr.expired())
		throw std::runtime_error(context ? context : "Invalid pointer!");
}